

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitArrayFill(PrintExpressionContents *this,ArrayFill *curr)

{
  ostream *stream;
  HeapType type;
  
  stream = this->o;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"array.fill ",0xb);
  Colors::outputColorCode(stream,"\x1b[0m");
  type = wasm::Type::getHeapType(&curr->ref->type);
  PrintSExpression::printHeapTypeName(this->parent,type);
  return;
}

Assistant:

void visitArrayFill(ArrayFill* curr) {
    printMedium(o, "array.fill ");
    printHeapTypeName(curr->ref->type.getHeapType());
  }